

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mkvmuxer.cc
# Opt level: O0

void __thiscall
mkvmuxer::Segment::MoveCuesBeforeClustersHelper
          (Segment *this,uint64_t diff,int32_t index,uint64_t *cues_size)

{
  int32 iVar1;
  int32 iVar2;
  int32_t iVar3;
  CuePoint *this_00;
  uint64_t uVar4;
  uint64_t uVar5;
  long lVar6;
  int local_54;
  int32_t i;
  uint64_t cue_size_diff;
  uint64_t cue_point_size_diff;
  uint64_t cluster_pos;
  uint64_t old_cue_point_size;
  CuePoint *cue_point;
  uint64_t *cues_size_local;
  int32_t index_local;
  uint64_t diff_local;
  Segment *this_local;
  
  this_00 = Cues::GetCueByIndex(&this->cues_,index);
  if (this_00 != (CuePoint *)0x0) {
    uVar4 = CuePoint::Size(this_00);
    uVar5 = CuePoint::cluster_pos(this_00);
    CuePoint::set_cluster_pos(this_00,uVar5 + diff);
    uVar5 = CuePoint::Size(this_00);
    lVar6 = uVar5 - uVar4;
    iVar1 = GetCodedUIntSize(*cues_size + lVar6);
    iVar2 = GetCodedUIntSize(*cues_size);
    *cues_size = lVar6 + *cues_size;
    uVar4 = (iVar1 - iVar2) + lVar6;
    if (uVar4 != 0) {
      for (local_54 = 0; iVar3 = Cues::cue_entries_size(&this->cues_), local_54 < iVar3;
          local_54 = local_54 + 1) {
        MoveCuesBeforeClustersHelper(this,uVar4,local_54,cues_size);
      }
    }
  }
  return;
}

Assistant:

void Segment::MoveCuesBeforeClustersHelper(uint64_t diff, int32_t index,
                                           uint64_t* cues_size) {
  CuePoint* const cue_point = cues_.GetCueByIndex(index);
  if (cue_point == NULL)
    return;
  const uint64_t old_cue_point_size = cue_point->Size();
  const uint64_t cluster_pos = cue_point->cluster_pos() + diff;
  cue_point->set_cluster_pos(cluster_pos);  // update the new cluster position
  // New size of the cue is computed as follows
  //    Let a = current sum of size of all CuePoints
  //    Let b = Increase in Cue Point's size due to this iteration
  //    Let c = Increase in size of Cues Element's length due to this iteration
  //            (This is computed as CodedSize(a + b) - CodedSize(a))
  //    Let d = b + c. Now d is the |diff| passed to the next recursive call.
  //    Let e = a + b. Now e is the |cues_size| passed to the next recursive
  //                   call.
  const uint64_t cue_point_size_diff = cue_point->Size() - old_cue_point_size;
  const uint64_t cue_size_diff =
      GetCodedUIntSize(*cues_size + cue_point_size_diff) -
      GetCodedUIntSize(*cues_size);
  *cues_size += cue_point_size_diff;
  diff = cue_size_diff + cue_point_size_diff;
  if (diff > 0) {
    for (int32_t i = 0; i < cues_.cue_entries_size(); ++i) {
      MoveCuesBeforeClustersHelper(diff, i, cues_size);
    }
  }
}